

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

NULLCRef * nullcGetLastErrorObject(void)

{
  NULLCRef *in_RDI;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      ExecutorRegVm::GetErrorObject(NULLC::executorRegVm);
      return in_RDI;
    }
    if (NULLC::currExec == 1) {
      ExecutorX86::GetErrorObject(NULLC::executorX86);
      return in_RDI;
    }
  }
  *(undefined4 *)((long)&in_RDI->ptr + 4) = 0;
  *(undefined8 *)in_RDI = 0;
  return in_RDI;
}

Assistant:

NULLCRef nullcGetLastErrorObject()
{
	using namespace NULLC;
	NULLCRef empty = { 0, 0 };
	NULLC_CHECK_INITIALIZED(empty);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetErrorObject();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetErrorObject();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetErrorObject();
#endif

	return empty;
}